

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O1

bool __thiscall Satyricon::SATSolver::assume(SATSolver *this,Literal p)

{
  literal_value lVar1;
  iterator __position;
  bool bVar2;
  literal_value lVar3;
  int local_14;
  
  lVar1 = (this->values).
          super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>.
          _M_impl.super__Vector_impl_data._M_start[(uint)p.value >> 1];
  lVar3 = LIT_TRUE - lVar1;
  if ((p.value & 1U) == 0) {
    lVar3 = lVar1;
  }
  if (lVar3 == LIT_UNASIGNED) {
    __position._M_current =
         (this->trail_limit).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->trail_limit).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->trail_limit,__position,&local_14);
    }
    else {
      *__position._M_current =
           (int)((ulong)((long)(this->trail).
                               super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->trail).
                              super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2);
      (this->trail_limit).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    bVar2 = assign(this,p,(ClausePtr)0x0);
    return bVar2;
  }
  __assert_fail("get_asigned_value(p) == LIT_UNASIGNED",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/src/sat_solver.cpp"
                ,0xcf,"bool Satyricon::SATSolver::assume(Literal)");
}

Assistant:

bool SATSolver::assume( Literal p ) {
    assert( get_asigned_value(p) == LIT_UNASIGNED);
    trail_limit.push_back(static_cast<int>(trail.size()));
    return assign(p, nullptr);
}